

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
xmrig::Pool::printableName_abi_cxx11_(Pool *this)

{
  bool bVar1;
  undefined1 uVar2;
  String *pSVar3;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *out;
  Pool *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [48];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  bVar1 = isEnabled(in_stack_fffffffffffffe20);
  if (bVar1) {
    bVar1 = isTLS((Pool *)0x1d04ce);
    uVar4 = 0x24;
    if (bVar1) {
      uVar4 = 0x20;
    }
  }
  else {
    uVar4 = 0x1f;
  }
  std::__cxx11::to_string((int)((ulong)in_RSI >> 0x20));
  std::operator+((char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (char *)in_stack_fffffffffffffe20);
  pSVar3 = url((Pool *)0x1d054a);
  String::data(pSVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (char *)in_stack_fffffffffffffe20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (char *)in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  if (*(int *)(in_RSI + 4) == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168," self-select ",&local_169);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                   (char *)in_stack_fffffffffffffe20);
    uVar2 = Url::isTLS((Url *)(in_RSI + 0x58));
    std::__cxx11::to_string((int)((ulong)in_RSI >> 0x20));
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(uVar4,in_stack_fffffffffffffe50));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffe28),(char *)in_stack_fffffffffffffe20);
    pSVar3 = Url::url((Url *)(in_RSI + 0x58));
    String::data(pSVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffe28),(char *)pSVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffe28),(char *)pSVar3);
    std::__cxx11::string::operator+=((string *)__lhs,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  return in_RDI;
}

Assistant:

std::string xmrig::Pool::printableName() const
{
    std::string out(CSI "1;" + std::to_string(isEnabled() ? (isTLS() ? 32 : 36) : 31) + "m" + url().data() + CLEAR);

    if (m_mode == MODE_SELF_SELECT) {
        out += std::string(" self-select ") + CSI "1;" + std::to_string(m_daemon.isTLS() ? 32 : 36) + "m" + m_daemon.url().data() + CLEAR;
    }

    return out;
}